

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::beckmann::sigma_std_radial(beckmann *this,float_t zi)

{
  float_t fVar1;
  float fVar2;
  double dVar3;
  float_t local_30;
  float local_2c;
  float local_28;
  float_t tmp;
  float_t nu;
  float_t local_1c;
  float_t z_i;
  float_t zi_local;
  beckmann *this_local;
  
  if ((zi != 1.0) || (NAN(zi))) {
    local_1c = zi;
    _z_i = this;
    tmp = sqr<float>(&local_1c);
    fVar2 = sat<float>(&tmp);
    dVar3 = std::sqrt((double)(ulong)(uint)(1.0 - fVar2));
    nu = SUB84(dVar3,0);
    local_28 = local_1c / nu;
    fVar2 = sqr<float>(&local_28);
    dVar3 = std::exp((double)(ulong)(uint)-fVar2);
    local_30 = m_pi();
    local_2c = inversesqrt<float>(&local_30);
    fVar1 = local_1c;
    local_2c = SUB84(dVar3,0) * local_2c;
    dVar3 = std::erf((double)(ulong)(uint)local_28);
    this_local._4_4_ = (fVar1 * (SUB84(dVar3,0) + 1.0) + nu * local_2c) / 2.0;
  }
  else {
    this_local._4_4_ = 1.0;
  }
  return this_local._4_4_;
}

Assistant:

float_t beckmann::sigma_std_radial(float_t zi) const
{
	if (zi == 1) return 1;
	float_t z_i = sqrt(1 - sat(sqr(zi)));
	float_t nu = zi / z_i;
	float_t tmp = exp(-sqr(nu)) * inversesqrt(m_pi());
	return (zi * (1 + erf(nu)) + z_i * tmp) / 2;
}